

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * adios2sys::SystemTools::GetFilenameWithoutLastExtension(string *filename)

{
  long lVar1;
  string *in_RDI;
  size_type dot_pos;
  string *name;
  string *in_stack_ffffffffffffffd8;
  
  GetFilenameName(in_stack_ffffffffffffffd8);
  lVar1 = std::__cxx11::string::rfind((char)in_RDI,0x2e);
  if (lVar1 != -1) {
    std::__cxx11::string::resize((ulong)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::GetFilenameWithoutLastExtension(
  const std::string& filename)
{
  std::string name = SystemTools::GetFilenameName(filename);
  std::string::size_type dot_pos = name.rfind('.');
  if (dot_pos != std::string::npos) {
    name.resize(dot_pos);
  }
  return name;
}